

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double bernoulli_poly(int n,double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *b;
  int *row;
  double *work;
  double value;
  int i;
  int *c;
  double x_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  b = (double *)operator_new__(uVar3);
  bernoulli_number(n,b);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(n + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  row = (int *)operator_new__(uVar3);
  for (value._4_4_ = 0; value._4_4_ <= n; value._4_4_ = value._4_4_ + 1) {
    comb_row_next(n,row);
  }
  work = (double *)0x3ff0000000000000;
  for (value._4_4_ = 1; value._4_4_ <= n; value._4_4_ = value._4_4_ + 1) {
    work = (double *)((double)work * x + b[value._4_4_] * (double)row[value._4_4_]);
  }
  if (row != (int *)0x0) {
    operator_delete__(row);
  }
  if (b != (double *)0x0) {
    operator_delete__(b);
  }
  return (double)work;
}

Assistant:

BURKHARDT_EXPORT
double bernoulli_poly ( int n, double x )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_POLY evaluates the Bernoulli polynomial of order N at X.
//
//  Discussion:
//
//    Thanks to Bart Vandewoestyne for pointing out an error in the previous
//    documentation, 31 January 2008.
//
//    Special values of the Bernoulli polynomial include:
//
//      B(N,0) = B(N,1) = B(N), the N-th Bernoulli number.
//
//      B'(N,X) = N * B(N-1,X)
//
//      B(N,X+1) - B(N,X) = N * X^(N-1)
//      B(N,X) = (-1)^N * B(N,1-X)
//
//    A formula for the Bernoulli polynomial in terms of the Bernoulli
//    numbers is:
//
//      B(N,X) = sum ( 0 <= K <= N ) B(K) * C(N,K) * X^(N-K)
//
//    The first few polynomials include:
//
//      B(0,X) = 1
//      B(1,X) = X    - 1/2
//      B(2,X) = X^2 -   X      +  1/6
//      B(3,X) = X^3 - 3/2*X^2 +  1/2*X
//      B(4,X) = X^4 - 2*X^3   +      X^2 - 1/30
//      B(5,X) = X^5 - 5/2*X^4 +  5/3*X^3 - 1/6*X
//      B(6,X) = X^6 - 3*X^5   +  5/2*X^4 - 1/2*X^2 + 1/42
//      B(7,X) = X^7 - 7/2*X^6 +  7/2*X^5 - 7/6*X^3 + 1/6*X
//      B(8,X) = X^8 - 4*X^7   + 14/3*X^6 - 7/3*X^4 + 2/3*X^2 - 1/30
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    31 January 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the Bernoulli polynomial to
//    be evaluated.  N must be 0 or greater.
//
//    Input, double X, the value of X at which the polynomial is to
//    be evaluated.
//
//    Output, double BERNOULLI_POLY, the value of B(N,X).
//
{
  int *c;
  int i;
  double value;
  double *work;

  work = new double[n+1];
  bernoulli_number ( n, work );
//
//  Get row N of Pascal's triangle.
//
  c = new int[n+1];
  for ( i = 0; i <= n; i++ )
  {
    comb_row_next ( n, c );
  }

  value = 1.0;
  for ( i = 1; i <= n; i++ )
  {
    value = value * x + work[i] * double(c[i]);
  }

  delete [] c;
  delete [] work;

  return value;
}